

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToDOT.cpp
# Opt level: O0

void __thiscall
OpenMPDefaultClause::generateDOT
          (OpenMPDefaultClause *this,ofstream *dot_file,int depth,int index,string *parent_node)

{
  char *pcVar1;
  OpenMPDirective *this_00;
  allocator<char> local_2a9;
  string local_2a8;
  string local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  string local_1e8;
  string local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string local_e8 [32];
  undefined1 local_c8 [8];
  string clause_string;
  allocator<char> local_91;
  undefined1 local_90 [8];
  string indent;
  string current_line;
  OpenMPDirective *variant_directive;
  string parameter_string;
  string *parent_node_local;
  int index_local;
  int depth_local;
  ofstream *dot_file_local;
  OpenMPDefaultClause *this_local;
  
  parameter_string.field_2._8_8_ = parent_node;
  std::__cxx11::string::string((string *)&variant_directive);
  std::__cxx11::string::string((string *)(indent.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_90,(long)depth,'\t',&local_91);
  std::allocator<char>::~allocator(&local_91);
  std::__cxx11::string::string((string *)local_c8);
  std::__cxx11::string::size();
  std::__cxx11::string::substr((ulong)local_e8,(ulong)parent_node);
  std::__cxx11::string::operator=((string *)parent_node,local_e8);
  std::__cxx11::string::~string(local_e8);
  std::__cxx11::string::operator=((string *)local_c8,"default");
  std::operator+(&local_1a8,parent_node,"_");
  std::operator+(&local_188,&local_1a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8);
  std::operator+(&local_168,&local_188,"_");
  std::__cxx11::to_string(&local_1c8,depth);
  std::operator+(&local_148,&local_168,&local_1c8);
  std::operator+(&local_128,&local_148,"_");
  std::__cxx11::to_string(&local_1e8,index);
  std::operator+(&local_108,&local_128,&local_1e8);
  std::__cxx11::string::operator=((string *)local_c8,(string *)&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::operator+(&local_268,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                 parent_node);
  std::operator+(&local_248,&local_268," -- ");
  std::operator+(&local_228,&local_248,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8);
  std::operator+(&local_208,&local_228,"\n");
  std::__cxx11::string::operator=((string *)(indent.field_2._M_local_buf + 8),(string *)&local_208);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_268);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  std::operator<<((ostream *)dot_file,pcVar1);
  std::__cxx11::string::operator+=((string *)local_90,"\t");
  this_00 = getVariantDirective(this);
  if (this_00 != (OpenMPDirective *)0x0) {
    std::__cxx11::string::string((string *)&local_288,(string *)local_c8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"",&local_2a9);
    OpenMPDirective::generateDOT(this_00,dot_file,depth + 1,0,&local_288,&local_2a8);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::allocator<char>::~allocator(&local_2a9);
    std::__cxx11::string::~string((string *)&local_288);
  }
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)(indent.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&variant_directive);
  return;
}

Assistant:

void OpenMPDefaultClause::generateDOT(std::ofstream& dot_file, int depth, int index, std::string parent_node) {

    std::string parameter_string;
    OpenMPDirective* variant_directive = NULL;
    std::string current_line;
    std::string indent = std::string(depth, '\t');
    std::string clause_string;
    //std::vector<OpenMPDirective*>* parameter_directives;
    parent_node = parent_node.substr(0, parent_node.size()-1);
    //OpenMPClauseKind clause_kind = this->getKind();

    clause_string = "default";

    clause_string = parent_node + "_" + clause_string + "_" + std::to_string(depth) + "_" + std::to_string(index);
    current_line = indent + parent_node + " -- " + clause_string + "\n";
    dot_file << current_line.c_str();
    indent += "\t";
    variant_directive = ((OpenMPDefaultClause*)this)->getVariantDirective();
    if (variant_directive != NULL) {
        variant_directive->generateDOT(dot_file, depth+1, 0, clause_string, "");
    };
}